

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralSurfaceConnection::IfcStructuralSurfaceConnection
          (IfcStructuralSurfaceConnection *this)

{
  IfcStructuralSurfaceConnection *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcStructuralConnection).field_0x140,
             "IfcStructuralSurfaceConnection");
  IfcStructuralConnection::IfcStructuralConnection
            (&this->super_IfcStructuralConnection,&PTR_construction_vtable_24__0107d080);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralSurfaceConnection,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralSurfaceConnection,_0UL> *)
             &(this->super_IfcStructuralConnection).
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>.field_0x20,
             &PTR_construction_vtable_24__0107d1b8);
  *(undefined8 *)&this->super_IfcStructuralConnection = 0x107cf50;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x140 = 0x107d068;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x88 = 0x107cf78;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x98 = 0x107cfa0;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0xd0 = 0x107cfc8;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x100 = 0x107cff0;
  (this->super_IfcStructuralConnection).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x107d018;
  *(undefined8 *)
   &(this->super_IfcStructuralConnection).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>.field_0x20 = 0x107d040
  ;
  return;
}

Assistant:

IfcStructuralSurfaceConnection() : Object("IfcStructuralSurfaceConnection") {}